

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ryg_dxt.cpp
# Opt level: O3

void ryg_dxt::PrepareOptTable3(sU8 *Table,sU8 *expand,sInt size)

{
  byte bVar1;
  sInt i;
  long lVar2;
  sInt max;
  ulong uVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  
  lVar2 = 0;
  do {
    if (0 < size) {
      iVar8 = 0x100;
      uVar7 = 0;
      do {
        uVar3 = 0;
        do {
          iVar5 = ((uint)expand[uVar3] + (uint)expand[uVar7] >> 1) - (int)lVar2;
          iVar6 = -iVar5;
          if (0 < iVar5) {
            iVar6 = iVar5;
          }
          iVar5 = (uint)expand[uVar3] - (uint)expand[uVar7];
          bVar1 = (byte)iVar5;
          bVar4 = -bVar1;
          if (0 < iVar5) {
            bVar4 = bVar1;
          }
          iVar6 = (uint)(bVar4 >> 5) + iVar6;
          if (iVar6 < iVar8) {
            Table[lVar2 * 2] = (sU8)uVar3;
            Table[lVar2 * 2 + 1] = (sU8)uVar7;
            iVar8 = iVar6;
          }
          uVar3 = uVar3 + 1;
        } while ((uint)size != uVar3);
        uVar7 = uVar7 + 1;
      } while (uVar7 != (uint)size);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x100);
  return;
}

Assistant:

static void PrepareOptTable3(sU8* Table, const sU8* expand, sInt size) {
  for (sInt i = 0; i < 256; i++) {
    sInt bestErr = 256;

    for (sInt min = 0; min < size; min++) {
      for (sInt max = 0; max < size; max++) {
        sInt mine = expand[min];
        sInt maxe = expand[max];
        sInt err = sAbs(((mine + maxe) >> 1) - i);
        err += ((sAbs(maxe - mine) * 8) >> 8);  // approx. .03f

        if (err < bestErr) {
          Table[i * 2 + 0] = max;
          Table[i * 2 + 1] = min;
          bestErr = err;
        }
      }
    }
  }
}